

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VkResult vmaAllocateMemoryPages
                   (VmaAllocator allocator,VkMemoryRequirements *pVkMemoryRequirements,
                   VmaAllocationCreateInfo *pCreateInfo,size_t allocationCount,
                   VmaAllocation *pAllocations,VmaAllocationInfo *pAllocationInfo)

{
  ulong in_RCX;
  VmaAllocator_T *in_RDX;
  long in_R9;
  size_t i;
  VkResult result;
  VkBuffer in_stack_00000070;
  bool in_stack_0000007e;
  bool in_stack_0000007f;
  VkMemoryRequirements *in_stack_00000080;
  VmaAllocator_T *in_stack_00000088;
  VkFlags in_stack_000000d0;
  VmaAllocationCreateInfo *in_stack_000000d8;
  VmaSuballocationType in_stack_000000e0;
  size_t in_stack_000000e8;
  VmaAllocation *in_stack_000000f0;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffff8c;
  ulong local_48;
  VkResult local_4;
  
  if (in_RCX == 0) {
    local_4 = VK_SUCCESS;
  }
  else {
    uVar1 = 0xffffffff;
    local_4 = VmaAllocator_T::AllocateMemory
                        (in_stack_00000088,in_stack_00000080,in_stack_0000007f,in_stack_0000007e,
                         in_stack_00000070,(VkImage)allocator,in_stack_000000d0,in_stack_000000d8,
                         in_stack_000000e0,in_stack_000000e8,in_stack_000000f0);
    if ((in_R9 != 0) && (local_4 == VK_SUCCESS)) {
      for (local_48 = 0; local_48 < in_RCX; local_48 = local_48 + 1) {
        VmaAllocator_T::GetAllocationInfo
                  (in_RDX,(VmaAllocation)CONCAT44(in_stack_ffffffffffffff8c,uVar1),
                   (VmaAllocationInfo *)0x3029ad);
      }
    }
  }
  return local_4;
}

Assistant:

VMA_CALL_PRE VkResult VMA_CALL_POST vmaAllocateMemoryPages(
    VmaAllocator allocator,
    const VkMemoryRequirements* pVkMemoryRequirements,
    const VmaAllocationCreateInfo* pCreateInfo,
    size_t allocationCount,
    VmaAllocation* pAllocations,
    VmaAllocationInfo* pAllocationInfo)
{
    if(allocationCount == 0)
    {
        return VK_SUCCESS;
    }

    VMA_ASSERT(allocator && pVkMemoryRequirements && pCreateInfo && pAllocations);

    VMA_DEBUG_LOG("vmaAllocateMemoryPages");

    VMA_DEBUG_GLOBAL_MUTEX_LOCK

    VkResult result = allocator->AllocateMemory(
        *pVkMemoryRequirements,
        false, // requiresDedicatedAllocation
        false, // prefersDedicatedAllocation
        VK_NULL_HANDLE, // dedicatedBuffer
        VK_NULL_HANDLE, // dedicatedImage
        UINT32_MAX, // dedicatedBufferImageUsage
        *pCreateInfo,
        VMA_SUBALLOCATION_TYPE_UNKNOWN,
        allocationCount,
        pAllocations);

    if(pAllocationInfo != VMA_NULL && result == VK_SUCCESS)
    {
        for(size_t i = 0; i < allocationCount; ++i)
        {
            allocator->GetAllocationInfo(pAllocations[i], pAllocationInfo + i);
        }
    }

    return result;
}